

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

void packint(luaL_Buffer *b,lua_Unsigned n,int islittle,int size,int neg)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  pcVar1 = luaL_prepbuffsize(b,(long)size);
  iVar3 = 0;
  if (islittle == 0) {
    iVar3 = size + -1;
  }
  pcVar1[iVar3] = (char)n;
  iVar2 = size + -2;
  for (iVar3 = 1; iVar3 < size; iVar3 = iVar3 + 1) {
    iVar4 = iVar3;
    if (islittle == 0) {
      iVar4 = iVar2;
    }
    iVar2 = iVar2 + -1;
    pcVar1[iVar4] = (char)(n >> 8);
    n = n >> 8;
  }
  if (8 < size && neg != 0) {
    iVar3 = 8;
    for (iVar2 = size + -9; iVar2 != -1; iVar2 = iVar2 + -1) {
      iVar4 = iVar3;
      if (islittle == 0) {
        iVar4 = iVar2;
      }
      iVar3 = iVar3 + 1;
      pcVar1[iVar4] = -1;
    }
  }
  b->n = b->n + (long)size;
  return;
}

Assistant:

static void packint (luaL_Buffer *b, lua_Unsigned n,
                     int islittle, int size, int neg) {
  char *buff = luaL_prepbuffsize(b, size);
  int i;
  buff[islittle ? 0 : size - 1] = (char)(n & MC);  /* first byte */
  for (i = 1; i < size; i++) {
    n >>= NB;
    buff[islittle ? i : size - 1 - i] = (char)(n & MC);
  }
  if (neg && size > SZINT) {  /* negative number need sign extension? */
    for (i = SZINT; i < size; i++)  /* correct extra bytes */
      buff[islittle ? i : size - 1 - i] = (char)MC;
  }
  luaL_addsize(b, size);  /* add result to buffer */
}